

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  bool bVar1;
  SourceCodeInfo_Location *pSVar2;
  pointer prVar3;
  char *in_R8;
  string_view separator;
  string local_58;
  iterator it;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  
  local_58._M_dataplus._M_p = (pointer)&p;
  p.first = this;
  p.second = info;
  absl::lts_20250127::
  call_once<void(&)(std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*),std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*>
            (&this->locations_by_path_once_,BuildLocationsByPath,
             (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
              **)&local_58);
  separator._M_str = in_R8;
  separator._M_len = (size_t)",";
  absl::lts_20250127::strings_internal::JoinRange<std::vector<int,std::allocator<int>>>
            (&local_58,(strings_internal *)path,(vector<int,_std::allocator<int>_> *)0x1,separator);
  it = absl::lts_20250127::container_internal::
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
       ::find<std::__cxx11::string>
                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
                   *)&this->locations_by_path_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
              *)&this->locations_by_path_);
  local_58._M_dataplus._M_p = (pointer)0x0;
  bVar1 = absl::lts_20250127::container_internal::operator==(&it,(iterator *)&local_58);
  if (bVar1) {
    pSVar2 = (SourceCodeInfo_Location *)0x0;
  }
  else {
    prVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
             ::iterator::operator->(&it);
    pSVar2 = prVar3->second;
  }
  return pSVar2;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  absl::call_once(locations_by_path_once_,
                  FileDescriptorTables::BuildLocationsByPath, &p);
  auto it = locations_by_path_.find(absl::StrJoin(path, ","));
  if (it == locations_by_path_.end()) return nullptr;
  return it->second;
}